

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O1

FilterSample __thiscall pbrt::FilterSampler::Sample(FilterSampler *this,Point2f *u)

{
  float fVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  FilterSample FVar15;
  
  FVar15.p = PiecewiseConstant2D::Sample(&this->distrib,u,(Float *)0x0);
  TVar2 = (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = TVar2.x;
  auVar11._4_4_ = TVar2.y;
  auVar8._8_8_ = extraout_XMM0_Qb;
  auVar8._0_4_ = FVar15.p.super_Tuple2<pbrt::Point2,_float>.x;
  auVar8._4_4_ = FVar15.p.super_Tuple2<pbrt::Point2,_float>.y;
  auVar9 = vsubps_avx(auVar8,auVar11);
  fVar1 = (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x;
  if (TVar2.x < fVar1) {
    auVar7 = auVar9._4_12_;
    auVar9._0_4_ = auVar9._0_4_ / (fVar1 - TVar2.x);
    auVar9._4_12_ = auVar7;
  }
  fVar1 = (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.y;
  auVar8 = vmovshdup_avx(auVar11);
  if (auVar8._0_4_ < fVar1) {
    auVar11 = vmovshdup_avx(auVar9);
    auVar12._0_4_ = auVar11._0_4_ / (fVar1 - auVar8._0_4_);
    auVar12._4_12_ = auVar11._4_12_;
    auVar9 = vinsertps_avx(auVar9,auVar12,0x10);
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar11 = vpsubd_avx(auVar13,auVar14);
  auVar8 = vcvtdq2ps_avx(auVar11);
  auVar6._8_4_ = 0x3f000000;
  auVar6._0_8_ = 0x3f0000003f000000;
  auVar6._12_4_ = 0x3f000000;
  auVar8 = vfmadd213ps_avx512vl(auVar8,auVar9,auVar6);
  auVar9 = vpcmpeqd_avx(auVar9,auVar9);
  auVar9 = vpaddd_avx(auVar11,auVar9);
  uVar3 = vcmpps_avx512vl(auVar8,ZEXT816(0) << 0x40,5);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vminps_avx512vl(auVar9,auVar8);
  auVar10._0_4_ = (int)(float)((uint)((byte)uVar3 & 1) * auVar9._0_4_);
  auVar10._4_4_ = (int)(float)((uint)((byte)(uVar3 >> 1) & 1) * auVar9._4_4_);
  auVar10._8_4_ = (int)(float)((uint)((byte)(uVar3 >> 2) & 1) * auVar9._8_4_);
  auVar10._12_4_ = (int)(float)((uint)((byte)(uVar3 >> 3) & 1) * auVar9._12_4_);
  auVar8 = vpsubd_avx(auVar10,auVar14);
  auVar9 = vpshufd_avx(auVar8,0x55);
  auVar9 = vpmulld_avx(auVar9,auVar11);
  auVar9 = vpaddd_avx(auVar8,auVar9);
  uVar4 = vcmpss_avx512f((undefined1  [16])0x0,ZEXT416((uint)(this->values).values[auVar9._0_4_]),
                         0xe);
  bVar5 = (bool)((byte)uVar4 & 1);
  FVar15.weight = (Float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * 0x3f800000);
  return FVar15;
}

Assistant:

Sample(const Point2f &u) const {
        Point2f p = distrib.Sample(u);
        Point2f p01 = Point2f(domain.Offset(p));
        Point2i pi(Clamp(p01.x * values.xSize() + 0.5f, 0, values.xSize() - 1),
                   Clamp(p01.y * values.ySize() + 0.5f, 0, values.ySize() - 1));
        return {p, values[pi] < 0 ? -1.f : 1.f};
    }